

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void * CallbackThreadFunc(void *userData)

{
  PaUtilBufferProcessor *bp;
  PaUtilCpuLoadMeasurer *measurer;
  unsigned_long numFrames;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *__retval;
  pthread_t pVar4;
  PaError PVar5;
  char *pcVar6;
  ulong uVar7;
  ulong callbackStatusFlags;
  int xrun;
  int callbackResult;
  unsigned_long local_d0;
  PaUnixThread *local_c8;
  ulong local_c0;
  PaStreamCallbackTimeInfo timeInfo;
  __pthread_unwind_buf_t __cancel_buf;
  
  timeInfo.outputBufferDacTime = 0.0;
  timeInfo.inputBufferAdcTime = 0.0;
  timeInfo.currentTime = 0.0;
  callbackResult = 0;
  iVar1 = __sigsetjmp(&__cancel_buf,0);
  if (iVar1 == 0) {
    __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
    pthread_testcancel();
    iVar1 = 0;
    pthread_setcancelstate(1,(int *)0x0);
    if (*(int *)((long)userData + 0x220) != 0) {
      if ((*(long *)((long)userData + 0x340) == 0) || (iVar1 = snd_pcm_prepare(), -1 < iVar1)) {
        if (((*(long *)((long)userData + 0x2c0) == 0) || (*(int *)((long)userData + 0x228) != 0)) ||
           (iVar1 = snd_pcm_prepare(), -1 < iVar1)) {
          snd_pcm_avail_update(*(undefined8 *)((long)userData + 0x340));
LAB_001103a6:
          local_c8 = (PaUnixThread *)((long)userData + 0x198);
          bp = (PaUtilBufferProcessor *)((long)userData + 0x68);
          measurer = (PaUtilCpuLoadMeasurer *)((long)userData + 0x50);
LAB_001103bd:
          xrun = 0;
          pthread_testcancel();
          iVar1 = PaUnixThread_StopRequested(local_c8);
          if (callbackResult == 0 && iVar1 != 0) {
            callbackResult = 1;
LAB_001103f8:
            *(uint *)((long)userData + 0x240) = (uint)(callbackResult == 2);
            PVar5 = 0;
            if ((*(int *)((long)userData + 0x240) != 0) ||
               (iVar1 = PaUtil_IsBufferProcessorOutputEmpty(bp), iVar1 != 0)) goto LAB_001105d2;
          }
          else if (callbackResult != 0) goto LAB_001103f8;
          paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)userData,&local_c0,&xrun);
          if (-1 < paUtilErr_) {
            uVar7 = local_c0;
            if (local_c0 != 0 && xrun == 0) {
              while( true ) {
                xrun = 0;
                if (*(double *)((long)userData + 0x278) <= 0.0) {
                  uVar3 = 0;
                }
                else {
                  *(undefined8 *)((long)userData + 0x278) = 0;
                  uVar3 = 4;
                }
                if (0.0 < *(double *)((long)userData + 0x280)) {
                  uVar3 = uVar3 | 2;
                  *(undefined8 *)((long)userData + 0x280) = 0;
                }
                callbackStatusFlags = uVar3;
                if ((*(long *)((long)userData + 0x2c0) != 0) &&
                   (*(long *)((long)userData + 0x340) != 0)) {
                  if (*(int *)((long)userData + 0x2e0) == 0) {
                    callbackStatusFlags = uVar3 | 1;
                  }
                  else {
                    callbackStatusFlags = uVar3 + 8;
                    if (*(int *)((long)userData + 0x360) != 0) {
                      callbackStatusFlags = uVar3;
                    }
                  }
                }
                CalculateTimeInfo((PaAlsaStream *)userData,&timeInfo);
                PaUtil_BeginBufferProcessing(bp,&timeInfo,callbackStatusFlags);
                PaUtil_BeginCpuLoadMeasurement(measurer);
                uVar3 = *(ulong *)((long)userData + 0x218);
                if (*(int *)((long)userData + 0x78) == 0) {
                  local_d0 = 0;
                  if (uVar3 <= uVar7) {
                    local_d0 = uVar3;
                  }
                }
                else {
                  local_d0 = uVar3;
                  if (uVar7 < uVar3) {
                    local_d0 = uVar7;
                  }
                }
                paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)userData,&local_d0,&xrun);
                numFrames = local_d0;
                if (paUtilErr_ < 0) {
                  pcVar6 = 
                  "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4339\n"
                  ;
                  goto LAB_001105c1;
                }
                if (local_d0 == 0) break;
                PaUtil_EndBufferProcessing(bp,&callbackResult);
                paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)userData,numFrames,&xrun);
                if (paUtilErr_ < 0) {
                  pcVar6 = 
                  "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4347\n"
                  ;
                  goto LAB_001105c1;
                }
                PaUtil_EndCpuLoadMeasurement(measurer,numFrames);
                if ((callbackResult != 0) || (uVar7 = uVar7 - numFrames, uVar7 == 0))
                goto LAB_001103bd;
              }
              PaUtil_EndCpuLoadMeasurement(measurer,0);
            }
            goto LAB_001103bd;
          }
          pcVar6 = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4269\n"
          ;
LAB_001105c1:
          PaUtil_DebugPrint(pcVar6);
          PVar5 = paUtilErr_;
          goto LAB_001105d2;
        }
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar6 = (char *)snd_strerror(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar6);
        }
        pcVar6 = 
        "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4216\n"
        ;
      }
      else {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar6 = (char *)snd_strerror(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar6);
        }
        pcVar6 = 
        "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4214\n"
        ;
      }
      PaUtil_DebugPrint(pcVar6);
      PVar5 = -9999;
      goto LAB_001105d2;
    }
    paUtilErr_ = PaUnixThread_PrepareNotify((PaUnixThread *)((long)userData + 0x198));
    if (paUtilErr_ < 0) goto LAB_0011061e;
    paUtilErr_ = AlsaStart((PaAlsaStream *)userData,iVar1);
    if (paUtilErr_ < 0) {
      pcVar6 = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4228\n"
      ;
    }
    else {
      paUtilErr_ = PaUnixThread_NotifyParent((PaUnixThread *)((long)userData + 0x198));
      if (-1 < paUtilErr_) goto LAB_001103a6;
      pcVar6 = 
      "Expression \'PaUnixThread_NotifyParent( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4229\n"
      ;
    }
  }
  else {
    OnExit(userData);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_buf);
LAB_0011061e:
    pcVar6 = 
    "Expression \'PaUnixThread_PrepareNotify( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4226\n"
    ;
  }
  PaUtil_DebugPrint(pcVar6);
  PVar5 = paUtilErr_;
LAB_001105d2:
  __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
  OnExit(userData);
  if (PVar5 != 0) {
    __retval = (int *)malloc(4);
    *__retval = PVar5;
    pthread_exit(__retval);
  }
  pthread_exit((void *)0x0);
}

Assistant:

static void *CallbackThreadFunc( void *userData )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*) userData;
    PaStreamCallbackTimeInfo timeInfo = {0, 0, 0};
    snd_pcm_sframes_t startThreshold = 0;
    int callbackResult = paContinue;
    PaStreamCallbackFlags cbFlags = 0;  /* We might want to keep state across iterations */
    int streamStarted = 0;

    assert( stream );
    /* Not implemented */
    assert( !stream->primeBuffers );

    /* Execute OnExit when exiting */
    pthread_cleanup_push( &OnExit, stream );
#ifdef PTHREAD_CANCELED
    /* 'Abort' will use thread cancellation to terminate the callback thread, but the Alsa-lib functions
     * are NOT cancel-safe, (and can end up in an inconsistent state).  So, disable cancelability for
     * the thread here, and just re-enable it for the poll() in PaAlsaStream_WaitForFrames(). */
    pthread_testcancel();
    pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
#endif

    /* @concern StreamStart If the output is being primed the output pcm needs to be prepared, otherwise the
     * stream is started immediately. The latter involves signaling the waiting main thread.
     */
    if( stream->primeBuffers )
    {
        snd_pcm_sframes_t avail;

        if( stream->playback.pcm )
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
        if( stream->capture.pcm && !stream->pcmsSynced )
            ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );

        /* We can't be certain that the whole ring buffer is available for priming, but there should be
         * at least one period */
        avail = alsa_snd_pcm_avail_update( stream->playback.pcm );
        startThreshold = avail - (avail % stream->playback.framesPerPeriod);
        assert( startThreshold >= stream->playback.framesPerPeriod );
    }
    else
    {
        PA_ENSURE( PaUnixThread_PrepareNotify( &stream->thread ) );
        /* Buffer will be zeroed */
        PA_ENSURE( AlsaStart( stream, 0 ) );
        PA_ENSURE( PaUnixThread_NotifyParent( &stream->thread ) );

        streamStarted = 1;
    }

    while( 1 )
    {
        unsigned long framesAvail, framesGot;
        int xrun = 0;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif

        /* @concern StreamStop if the main thread has requested a stop and the stream has not been effectively
         * stopped we signal this condition by modifying callbackResult (we'll want to flush buffered output).
         */
        if( PaUnixThread_StopRequested( &stream->thread ) && paContinue == callbackResult )
        {
            PA_DEBUG(( "Setting callbackResult to paComplete\n" ));
            callbackResult = paComplete;
        }

        if( paContinue != callbackResult )
        {
            stream->callbackAbort = ( paAbort == callbackResult );
            if( stream->callbackAbort ||
                    /** @concern BlockAdaption: Go on if adaption buffers are empty */
                    PaUtil_IsBufferProcessorOutputEmpty( &stream->bufferProcessor ) )
            {
                goto end;
            }

            PA_DEBUG(( "%s: Flushing buffer processor\n", __FUNCTION__ ));
            /* There is still buffered output that needs to be processed */
        }

        /* Wait for data to become available, this comes down to polling the ALSA file descriptors untill we have
         * a number of available frames.
         */
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        if( xrun )
        {
            assert( 0 == framesAvail );
            continue;

            /* XXX: Report xruns to the user? A situation is conceivable where the callback is never invoked due
             * to constant xruns, it might be desirable to notify the user of this.
             */
        }

        /* Consume buffer space. Once we have a number of frames available for consumption we must retrieve the
         * mmapped buffers from ALSA, this is contiguously accessible memory however, so we may receive smaller
         * portions at a time than is available as a whole. Therefore we should be prepared to process several
         * chunks successively. The buffers are passed to the PA buffer processor.
         */
        while( framesAvail > 0 )
        {
            xrun = 0;

            /** @concern Xruns Under/overflows are to be reported to the callback */
            if( stream->underrun > 0.0 )
            {
                cbFlags |= paOutputUnderflow;
                stream->underrun = 0.0;
            }
            if( stream->overrun > 0.0 )
            {
                cbFlags |= paInputOverflow;
                stream->overrun = 0.0;
            }
            if( stream->capture.pcm && stream->playback.pcm )
            {
                /** @concern FullDuplex It's possible that only one direction is being processed to avoid an
                 * under- or overflow, this should be reported correspondingly */
                if( !stream->capture.ready )
                {
                    cbFlags |= paInputUnderflow;
                    PA_DEBUG(( "%s: Input underflow\n", __FUNCTION__ ));
                }
                else if( !stream->playback.ready )
                {
                    cbFlags |= paOutputOverflow;
                    PA_DEBUG(( "%s: Output overflow\n", __FUNCTION__ ));
                }
            }

#if 0
            CallbackUpdate( &stream->threading );
#endif

            CalculateTimeInfo( stream, &timeInfo );
            PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, cbFlags );
            cbFlags = 0;

            /* CPU load measurement should include processing activity external to the stream callback */
            PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );

            framesGot = framesAvail;
            if( paUtilFixedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode )
            {
                /* We've committed to a fixed host buffer size, stick to that */
                framesGot = framesGot >= stream->maxFramesPerHostBuffer ? stream->maxFramesPerHostBuffer : 0;
            }
            else
            {
                /* We've committed to an upper bound on the size of host buffers */
                assert( paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode );
                framesGot = PA_MIN( framesGot, stream->maxFramesPerHostBuffer );
            }
            PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
            /* Check the host buffer size against the buffer processor configuration */
            framesAvail -= framesGot;

            if( framesGot > 0 )
            {
                assert( !xrun );
                PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );
                PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            }
            PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesGot );

            if( 0 == framesGot )
            {
                /* Go back to polling for more frames */
                break;
            }

            if( paContinue != callbackResult )
                break;
        }
    }

end:
    ; /* Hack to fix "label at end of compound statement" error caused by pthread_cleanup_pop(1) macro. */
    /* Match pthread_cleanup_push */
    pthread_cleanup_pop( 1 );

    PA_DEBUG(( "%s: Thread %d exiting\n ", __FUNCTION__, pthread_self() ));
    PaUnixThreading_EXIT( result );

error:
    PA_DEBUG(( "%s: Thread %d is canceled due to error %d\n ", __FUNCTION__, pthread_self(), result ));
    goto end;
}